

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_session.hpp
# Opt level: O3

response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
* __thiscall
m2d::savanna::url_session::
send_request<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
          (response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *__return_storage_ptr__,url_session *this,
          ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
          *stream,url *url,request<get_yahoo_endpoint> *request)

{
  node_ptr prVar1;
  list_t *plVar2;
  header_holder_type *phVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Rb_tree_header *p_Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pcVar12;
  undefined1 *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  node_ptr plVar15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar16;
  dummy_u *pdVar17;
  _Base_ptr p_Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string_view name;
  string_view sVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  url new_url;
  string path;
  request<http::string_body> req;
  flat_buffer buffer;
  undefined1 *local_410;
  long local_408;
  undefined1 local_400 [16];
  url local_3f0;
  url local_330;
  string local_270;
  request<get_yahoo_endpoint> local_250;
  string local_1a8;
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_188;
  basic_flat_buffer<std::allocator<char>_> local_108;
  response<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  local_d8;
  
  savanna::url::to_string_abi_cxx11_(&local_1a8,url);
  sVar22.len_ = local_1a8._M_string_length;
  sVar22.ptr_ = local_1a8._M_dataplus._M_p;
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::
  header<>(&local_188.super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>,
           get,sVar22,request->version);
  local_188.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_dataplus._M_p =
       (pointer)&local_188.
                 super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                 .value_.field_2;
  local_188.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_._M_string_length = 0;
  local_188.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._M_local_buf[0] = '\0';
  paVar5 = &local_3f0.scheme_.field_2;
  pcVar12 = (url->host_)._M_dataplus._M_p;
  local_3f0.scheme_._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,pcVar12,pcVar12 + (url->host_)._M_string_length);
  local_d8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void>.size_ =
       (unsigned_long)local_3f0.scheme_._M_dataplus._M_p;
  local_d8.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)local_3f0.scheme_._M_string_length;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&local_188,host,(string_view *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.scheme_._M_dataplus._M_p != paVar5) {
    operator_delete(local_3f0.scheme_._M_dataplus._M_p);
  }
  local_3f0.scheme_._M_dataplus._M_p = "Boost.Beast/300";
  local_3f0.scheme_._M_string_length = 0xf;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)&local_188,user_agent,(string_view *)&local_3f0)
  ;
  p_Var18 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(request->header_fields)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var18 != p_Var6) {
    do {
      local_3f0.scheme_._M_dataplus._M_p = *(pointer *)(p_Var18 + 2);
      local_3f0.scheme_._M_string_length = (size_type)p_Var18[2]._M_parent;
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                ((basic_fields<std::allocator<char>_> *)&local_188,*(string_view *)(p_Var18 + 1),
                 (string_view *)&local_3f0);
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
    } while ((_Rb_tree_header *)p_Var18 != p_Var6);
  }
  boost::beast::http::
  write<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (stream,&local_188);
  local_108.out_ = (char *)0x0;
  local_108.last_ = (char *)0x0;
  local_108.begin_ = (char *)0x0;
  local_108.in_ = (char *)0x0;
  local_108.end_ = (char *)0x0;
  local_108.max_ = 0x7fffffffffffffff;
  prVar1 = (node_ptr)
           &(__return_storage_ptr__->
            super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
            super_basic_fields<std::allocator<char>_>.set_.
            super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
  ;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase3<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
  .holder.root.super_node.parent_ = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
   + 8) = (node_ptr)0x0;
  *(node_ptr *)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = (node_ptr)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
   + 0x18) = 0;
  *(node_ptr *)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
   + 8) = prVar1;
  *(node_ptr *)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.set_.
           super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
           .
           super_bstbase2<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_(boost::intrusive::algo_types)5,_void>
   + 0x10) = prVar1;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.set_.
  super_bstree_impl<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .
  super_bstbase_hack<boost::intrusive::bhtraits<boost::beast::http::basic_fields<std::allocator<char>_>::element,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::beast::http::basic_fields<std::allocator<char>_>::key_compare,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
  .super_size_holder<true,_unsigned_long,_void> = 0;
  plVar2 = &(__return_storage_ptr__->
            super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
            super_basic_fields<std::allocator<char>_>.list_;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)plVar2;
  *(list_t **)
   ((long)&(__return_storage_ptr__->
           super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
           super_basic_fields<std::allocator<char>_>.list_.data_.root_plus_size_.m_header.super_node
   + 8) = plVar2;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.method_.ptr_ = (char *)0x0;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.method_.len_ = 0;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.target_or_reason_.ptr_ = (char *)0x0;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).
  super_basic_fields<std::allocator<char>_>.target_or_reason_.len_ = 0;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).version_ = 0xb;
  (__return_storage_ptr__->
  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).result_ = ok;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.max_
       = 0xfffffffffffffff;
  phVar3 = &(__return_storage_ptr__->
            super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).
            value_.list_.data_.root_plus_size_.m_header;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  list_.data_.root_plus_size_.super_size_traits.size_ = 0;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  list_.data_.root_plus_size_.m_header.super_node.next_ = &phVar3->super_node;
  *(header_holder_type **)
   ((long)&(__return_storage_ptr__->
           super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).
           value_.list_.data_.root_plus_size_.m_header.super_node + 8) = phVar3;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.out_
  .members_.nodeptr_ = &phVar3->super_node;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  in_size_ = 0;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  in_pos_ = 0;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  out_pos_ = 0;
  (__return_storage_ptr__->
  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>).value_.
  out_end_ = 0;
  boost::beast::http::
  read<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,std::allocator<char>>
            (stream,&local_108,__return_storage_ptr__);
  if (((__return_storage_ptr__->
       super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>).result_ -
       multiple_choices < 100) && (request->follow_location == true)) {
    name.len_ = 8;
    name.ptr_ = "Location";
    sVar22 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                       ((basic_fields<std::allocator<char>_> *)__return_storage_ptr__,name);
    local_410 = local_400;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,sVar22.ptr_,sVar22.ptr_ + sVar22.len_);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_410,local_410 + local_408);
    savanna::url::url(&local_3f0,&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    local_330.scheme_._M_dataplus._M_p = (pointer)&local_330.scheme_.field_2;
    paVar5 = &local_3f0.scheme_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.scheme_._M_dataplus._M_p == paVar5) {
      local_330.scheme_.field_2._8_8_ = local_3f0.scheme_.field_2._8_8_;
    }
    else {
      local_330.scheme_._M_dataplus._M_p = local_3f0.scheme_._M_dataplus._M_p;
    }
    paVar7 = &local_3f0.host_.field_2;
    local_330.host_._M_dataplus._M_p = (pointer)&local_330.host_.field_2;
    local_330.scheme_._M_string_length = local_3f0.scheme_._M_string_length;
    local_3f0.scheme_._M_string_length = 0;
    local_3f0.scheme_.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.host_._M_dataplus._M_p == paVar7) {
      local_330.host_.field_2._8_8_ = local_3f0.host_.field_2._8_8_;
    }
    else {
      local_330.host_._M_dataplus._M_p = local_3f0.host_._M_dataplus._M_p;
    }
    paVar10 = &local_3f0.port_.field_2;
    local_330.port_._M_dataplus._M_p = (pointer)&local_330.port_.field_2;
    local_330.host_._M_string_length = local_3f0.host_._M_string_length;
    local_3f0.host_._M_string_length = 0;
    local_3f0.host_.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.port_._M_dataplus._M_p == paVar10) {
      local_330.port_.field_2._8_8_ = local_3f0.port_.field_2._8_8_;
    }
    else {
      local_330.port_._M_dataplus._M_p = local_3f0.port_._M_dataplus._M_p;
    }
    paVar11 = &local_3f0.path_.field_2;
    local_330.path_._M_dataplus._M_p = (pointer)&local_330.path_.field_2;
    local_330.port_._M_string_length = local_3f0.port_._M_string_length;
    local_3f0.port_._M_string_length = 0;
    local_3f0.port_.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.path_._M_dataplus._M_p == paVar11) {
      local_330.path_.field_2._8_8_ = local_3f0.path_.field_2._8_8_;
    }
    else {
      local_330.path_._M_dataplus._M_p = local_3f0.path_._M_dataplus._M_p;
    }
    local_330.path_._M_string_length = local_3f0.path_._M_string_length;
    local_3f0.path_._M_string_length = 0;
    local_3f0.path_.field_2._M_local_buf[0] = '\0';
    paVar4 = &local_330.query_.field_2;
    paVar21 = &local_3f0.query_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.query_._M_dataplus._M_p == paVar21) {
      local_330.query_.field_2._8_8_ = local_3f0.query_.field_2._8_8_;
      local_330.query_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_330.query_._M_dataplus._M_p = local_3f0.query_._M_dataplus._M_p;
    }
    local_330.query_._M_string_length = local_3f0.query_._M_string_length;
    local_3f0.query_._M_string_length = 0;
    local_3f0.query_.field_2._M_local_buf[0] = '\0';
    paVar19 = &local_330.fragment_.field_2;
    paVar20 = &local_3f0.fragment_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.fragment_._M_dataplus._M_p == paVar20) {
      local_330.fragment_.field_2._8_8_ = local_3f0.fragment_.field_2._8_8_;
      local_330.fragment_._M_dataplus._M_p = (pointer)paVar19;
    }
    else {
      local_330.fragment_._M_dataplus._M_p = local_3f0.fragment_._M_dataplus._M_p;
    }
    local_330.fragment_._M_string_length = local_3f0.fragment_._M_string_length;
    local_3f0.fragment_._M_string_length = 0;
    local_3f0.fragment_.field_2._M_local_buf[0] = '\0';
    local_250.follow_location = request->follow_location;
    local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
    if ((request->endpoint).super_get_endpoint.query_.super_type.m_initialized == true) {
      local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ =
           (long)&local_250.endpoint.super_get_endpoint.query_.super_type.m_storage + 8;
      local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ =
           *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                            dummy_ + 0x10);
      if (local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ == 0) {
        pdVar17 = &local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ = 0;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ = 0;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
             local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
      }
      else {
        puVar8 = (undefined1 *)
                 ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
                 8);
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._8_4_ =
             *(undefined4 *)
              ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 8)
        ;
        puVar13 = *(undefined1 **)
                   ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_
                   + 0x18);
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._32_8_ =
             *(long *)((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.
                              dummy_ + 0x20);
        *(undefined8 *)
         (local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._16_8_ + 8) =
             local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_;
        pdVar17 = &(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._40_8_ =
             *(undefined8 *)
              ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ +
              0x28);
        *(undefined8 *)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x10) =
             0;
        *(undefined1 **)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x18) =
             puVar8;
        *(undefined1 **)
         ((long)&(request->endpoint).super_get_endpoint.query_.super_type.m_storage.dummy_ + 0x20) =
             puVar8;
        local_250.endpoint.super_get_endpoint.query_.super_type.m_storage.dummy_._24_8_ = puVar13;
      }
      *(undefined8 *)((long)pdVar17 + 0x28) = 0;
      local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = true;
    }
    local_250.body._M_dataplus._M_p = (pointer)&local_250.body.field_2;
    local_250.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
         (_func_int **)&PTR_scheme_abi_cxx11__00217260;
    local_250.version = request->version;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(request->body)._M_dataplus._M_p;
    paVar9 = &(request->body).field_2;
    if (paVar14 == paVar9) {
      local_250.body.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_250.body.field_2._8_8_ = *(undefined8 *)((long)&(request->body).field_2 + 8);
    }
    else {
      local_250.body.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_250.body._M_dataplus._M_p = (pointer)paVar14;
    }
    local_250.body._M_string_length = (request->body)._M_string_length;
    local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header;
    (request->body)._M_dataplus._M_p = (pointer)paVar9;
    (request->body)._M_string_length = 0;
    (request->body).field_2._M_local_buf[0] = '\0';
    local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      pmVar16 = &local_250.header_fields;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      p_Var18 = (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar16 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&(request->header_fields)._M_t._M_impl;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var6->_M_header;
      (request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var6->_M_header;
      local_250.header_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var18;
    }
    *(size_t *)((long)&(pmVar16->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
    local_250.timeout_interval.__r = (request->timeout_interval).__r;
    local_3f0.scheme_._M_dataplus._M_p = (pointer)paVar5;
    local_3f0.host_._M_dataplus._M_p = (pointer)paVar7;
    local_3f0.port_._M_dataplus._M_p = (pointer)paVar10;
    local_3f0.path_._M_dataplus._M_p = (pointer)paVar11;
    local_3f0.query_._M_dataplus._M_p = (pointer)paVar21;
    local_3f0.fragment_._M_dataplus._M_p = (pointer)paVar20;
    send_request<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
              (&local_d8,this,stream,&local_330,&local_250);
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::operator=(__return_storage_ptr__,&local_d8);
    while (local_d8.
           super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
           value_.list_.data_.root_plus_size_.m_header.super_node.next_ !=
           (node_ptr)
           ((long)&local_d8.
                   super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                   .value_.list_.data_.root_plus_size_ + 8U)) {
      plVar15 = (local_d8.
                 super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                 .value_.list_.data_.root_plus_size_.m_header.super_node.next_)->next_;
      operator_delete(local_d8.
                      super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                      .value_.list_.data_.root_plus_size_.m_header.super_node.next_);
      local_d8.super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
      .value_.list_.data_.root_plus_size_.m_header.super_node.next_ = plVar15;
    }
    boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
              ((basic_fields<std::allocator<char>_> *)&local_d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_250.header_fields._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250.body._M_dataplus._M_p != &local_250.body.field_2) {
      operator_delete(local_250.body._M_dataplus._M_p);
    }
    local_250.endpoint.super_get_endpoint.super_endpoint._vptr_endpoint =
         (_func_int **)&PTR_scheme_abi_cxx11__002172f8;
    if (local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized == true) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_250.endpoint.super_get_endpoint.query_.super_type.m_storage);
      local_250.endpoint.super_get_endpoint.query_.super_type.m_initialized = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.fragment_._M_dataplus._M_p != paVar19) {
      operator_delete(local_330.fragment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.query_._M_dataplus._M_p != paVar4) {
      operator_delete(local_330.query_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.path_._M_dataplus._M_p != &local_330.path_.field_2) {
      operator_delete(local_330.path_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.port_._M_dataplus._M_p != &local_330.port_.field_2) {
      operator_delete(local_330.port_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.host_._M_dataplus._M_p != &local_330.host_.field_2) {
      operator_delete(local_330.host_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.scheme_._M_dataplus._M_p != &local_330.scheme_.field_2) {
      operator_delete(local_330.scheme_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.fragment_._M_dataplus._M_p != paVar20) {
      operator_delete(local_3f0.fragment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.query_._M_dataplus._M_p != paVar21) {
      operator_delete(local_3f0.query_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.path_._M_dataplus._M_p != &local_3f0.path_.field_2) {
      operator_delete(local_3f0.path_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.port_._M_dataplus._M_p != &local_3f0.port_.field_2) {
      operator_delete(local_3f0.port_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.host_._M_dataplus._M_p != &local_3f0.host_.field_2) {
      operator_delete(local_3f0.host_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0.scheme_._M_dataplus._M_p != &local_3f0.scheme_.field_2) {
      operator_delete(local_3f0.scheme_._M_dataplus._M_p);
    }
    if (local_410 != local_400) {
      operator_delete(local_410);
    }
  }
  if (local_108.begin_ != (char *)0x0) {
    operator_delete(local_108.begin_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.
         super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
         .value_._M_dataplus._M_p !=
      &local_188.
       super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
       .value_.field_2) {
    operator_delete(local_188.
                    super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                    .value_._M_dataplus._M_p);
  }
  boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
            ((basic_fields<std::allocator<char>_> *)&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

http::response<Body> send_request(Stream &stream, savanna::url url, savanna::request<Endpoint> request)
		{
			std::string path = url.to_string();

			http::request<http::string_body> req(request.endpoint.method(), path, request.version);
			req.set(http::field::host, url.host());
			req.set(http::field::user_agent, BOOST_BEAST_VERSION_STRING);

			for (auto h = request.header_fields.begin(); h != request.header_fields.end(); ++h) {
				req.set(h->first, h->second);
			}

			if (request.endpoint.method() != http::verb::get) {
				if (request.endpoint.params()) {
					auto p = *request.endpoint.params();
					req.body() = request.body + savanna::param_str(p);
					req.prepare_payload();
				}
				else {
					req.body() = request.body;
					req.prepare_payload();
				}
			}
			http::write(stream, req);

			beast::flat_buffer buffer;
			http::response<Body> response;
			http::read(stream, buffer, response);

			if ((response.result_int() >= 300) && response.result_int() < 400 && request.follow_location) {
				auto location = response.base()["Location"].to_string();
				auto new_url = savanna::url(location);
				response = send_request<Stream, Body>(stream, std::move(new_url), std::move(request));
			}

			return response;
		}